

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O3

bool __thiscall ui::Led::OnEvent(Led *this,Event *event)

{
  int iVar1;
  pointer pcVar2;
  pointer pbVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_288 [2];
  long local_278 [2];
  undefined1 local_268 [24];
  _Alloc_hider local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  ScreenInteractive *local_230;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  iVar1 = this->trigger_selected_;
  local_268._16_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
  local_268._0_4_ = event->type_;
  local_268._4_4_ = (event->field_1).mouse_.button;
  local_268._8_4_ = (event->field_1).mouse_.motion;
  local_268._12_4_ = *(undefined4 *)((long)&event->field_1 + 8);
  pcVar2 = (event->input_)._M_dataplus._M_p;
  local_250._M_p = (pointer)&local_240;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar2,pcVar2 + (event->input_)._M_string_length);
  local_230 = event->screen_;
  bVar4 = ftxui::ComponentBase::OnEvent(&this->super_ComponentBase,(Event *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_p != &local_240) {
    operator_delete(local_250._M_p,local_240._M_allocated_capacity + 1);
  }
  if (iVar1 != this->trigger_selected_) {
    pcVar2 = (this->file_path_)._M_dataplus._M_p;
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_288,pcVar2,pcVar2 + (this->file_path_)._M_string_length);
    std::__cxx11::string::append((char *)local_288);
    std::ofstream::ofstream(&local_228,(string *)local_288,_S_out);
    pbVar3 = (this->trigger_entries_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,pbVar3[this->trigger_selected_]._M_dataplus._M_p,
               pbVar3[this->trigger_selected_]._M_string_length);
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _execvp;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
    if (local_288[0] != local_278) {
      operator_delete(local_288[0],local_278[0] + 1);
    }
    FetchState(this);
  }
  return bVar4;
}

Assistant:

bool OnEvent(Event event) override {
    int trigger_selected = trigger_selected_;
    bool ret = ComponentBase::OnEvent(event);
    if (trigger_selected != trigger_selected_) {
      std::ofstream(file_path_ + "/trigger")
          << trigger_entries_[trigger_selected_];
      FetchState();
    }
    return ret;
  }